

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void par_shapes__weld_points(par_shapes_mesh *mesh,int gridsize,float epsilon,uint16_t *weldmap)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  void *pvVar5;
  float *pfVar6;
  float *__src;
  float *pfVar7;
  ushort *puVar8;
  long *in_FS_OFFSET;
  float fVar9;
  int iStack_220;
  uint16_t c_1;
  uint16_t b_1;
  uint16_t a;
  int i_3;
  int ntriangles;
  uint16_t *tdst;
  uint16_t *tsrc;
  uint local_1a8;
  int local_1a4;
  int p_2;
  int ci;
  float *src;
  uint16_t *cmap;
  uint16_t *condensed_map;
  float *dst;
  float *newpts;
  int npoints;
  int nextbinindex;
  int k_2;
  int j_2;
  int i_2;
  float *nextpt;
  float dist2;
  float *thatpt;
  uint16_t nindex;
  uint16_t binvalue_1;
  int binindex_1;
  int b;
  int iStack_a4;
  uint16_t binvalue;
  int binindex;
  int k_1;
  int j_1;
  int i_1;
  int c;
  int maxp [3];
  int minp [3];
  int nbins;
  int nearby [8];
  int p_1;
  int nremoved;
  float *pt;
  int this_binindex;
  int k;
  int j;
  int i;
  float *pt_1;
  int p;
  int prev_binindex;
  uint16_t *bins;
  uint16_t *weldmap_local;
  float epsilon_local;
  int gridsize_local;
  par_shapes_mesh *mesh_local;
  
  pvVar5 = rf_calloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),
                             (long)(gridsize * gridsize * gridsize),2);
  pt_1._4_4_ = -1;
  for (pt_1._0_4_ = 0; (int)pt_1 < mesh->npoints; pt_1._0_4_ = (int)pt_1 + 1) {
    pfVar6 = mesh->points + (int)pt_1 * 3;
    iVar4 = (int)*pfVar6 + gridsize * (int)pfVar6[1] + gridsize * gridsize * (int)pfVar6[2];
    if (iVar4 != pt_1._4_4_) {
      *(short *)((long)pvVar5 + (long)iVar4 * 2) = (short)(int)pt_1 + 1;
    }
    pt_1._4_4_ = iVar4;
  }
  _p_1 = mesh->points;
  nearby[7] = 0;
  nearby[6] = 0;
  do {
    if (mesh->npoints <= nearby[6]) {
      (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
      iVar4 = mesh->npoints - nearby[7];
      pfVar6 = (float *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
      __src = (float *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
      _p_2 = mesh->points;
      local_1a4 = 0;
      src = __src;
      condensed_map = (uint16_t *)pfVar6;
      for (local_1a8 = 0; (int)local_1a8 < mesh->npoints; local_1a8 = local_1a8 + 1) {
        if (weldmap[(int)local_1a8] == local_1a8) {
          *(float *)condensed_map = *_p_2;
          pfVar7 = (float *)(condensed_map + 4);
          *(float *)(condensed_map + 2) = _p_2[1];
          condensed_map = condensed_map + 6;
          *pfVar7 = _p_2[2];
          *(short *)src = (short)local_1a4;
          local_1a4 = local_1a4 + 1;
        }
        else {
          *(undefined2 *)src = *(undefined2 *)((long)__src + (ulong)weldmap[(int)local_1a8] * 2);
        }
        src = (float *)((long)src + 2);
        _p_2 = _p_2 + 3;
      }
      if (local_1a4 != iVar4) {
        __assert_fail("ci == npoints",
                      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                      ,0x6543,
                      "void par_shapes__weld_points(par_shapes_mesh *, int, float, uint16_t *)");
      }
      (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
      memcpy(weldmap,__src,(long)mesh->npoints << 1);
      (**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,3);
      mesh->points = pfVar6;
      mesh->npoints = iVar4;
      tdst = mesh->triangles;
      _i_3 = mesh->triangles;
      _b_1 = 0;
      iStack_220 = 0;
      do {
        if (mesh->ntriangles <= iStack_220) {
          mesh->ntriangles = _b_1;
          return;
        }
        uVar1 = weldmap[*tdst];
        uVar2 = weldmap[tdst[1]];
        uVar3 = weldmap[tdst[2]];
        if (((uVar1 != uVar2) && (uVar1 != uVar3)) && (uVar2 != uVar3)) {
          if (mesh->npoints <= (int)(uint)uVar1) {
            __assert_fail("a < mesh->npoints",
                          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                          ,0x6553,
                          "void par_shapes__weld_points(par_shapes_mesh *, int, float, uint16_t *)")
            ;
          }
          if (mesh->npoints <= (int)(uint)uVar2) {
            __assert_fail("b < mesh->npoints",
                          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                          ,0x6554,
                          "void par_shapes__weld_points(par_shapes_mesh *, int, float, uint16_t *)")
            ;
          }
          if (mesh->npoints <= (int)(uint)uVar3) {
            __assert_fail("c < mesh->npoints",
                          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                          ,0x6555,
                          "void par_shapes__weld_points(par_shapes_mesh *, int, float, uint16_t *)")
            ;
          }
          *_i_3 = uVar1;
          puVar8 = _i_3 + 2;
          _i_3[1] = uVar2;
          _i_3 = _i_3 + 3;
          *puVar8 = uVar3;
          _b_1 = _b_1 + 1;
        }
        iStack_220 = iStack_220 + 1;
        tdst = tdst + 3;
      } while( true );
    }
    if ((uint)weldmap[nearby[6]] == nearby[6]) {
      minp[1] = 0;
      for (j_1 = 0; j_1 < 3; j_1 = j_1 + 1) {
        maxp[(long)j_1 + 1] = (int)(_p_1[j_1] - epsilon);
        (&i_1)[j_1] = (int)(_p_1[j_1] + epsilon);
      }
      for (k_1 = maxp[1]; k_1 <= i_1; k_1 = k_1 + 1) {
        for (binindex = maxp[2]; binindex <= c; binindex = binindex + 1) {
          for (iStack_a4 = minp[0]; iStack_a4 <= maxp[0]; iStack_a4 = iStack_a4 + 1) {
            iVar4 = k_1 + gridsize * binindex + gridsize * gridsize * iStack_a4;
            if (*(short *)((long)pvVar5 + (long)iVar4 * 2) != 0) {
              if (minp[1] == 8) {
                printf("Epsilon value is too large.\n");
                break;
              }
              minp[(long)minp[1] + 2] = iVar4;
              minp[1] = minp[1] + 1;
            }
          }
        }
      }
      for (_nindex = 0; _nindex < minp[1]; _nindex = _nindex + 1) {
        iVar4 = minp[(long)_nindex + 2];
        thatpt._0_2_ = *(short *)((long)pvVar5 + (long)iVar4 * 2) - 1;
        if (mesh->npoints <= (int)(uint)(ushort)thatpt) {
          __assert_fail("nindex < mesh->npoints",
                        "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                        ,0x6511,
                        "void par_shapes__weld_points(par_shapes_mesh *, int, float, uint16_t *)");
        }
        do {
          if ((((uint)(ushort)thatpt != nearby[6]) && (weldmap[(ushort)thatpt] == (ushort)thatpt))
             && (fVar9 = par_shapes__sqrdist3(mesh->points + (int)((uint)(ushort)thatpt * 3),_p_1),
                fVar9 < epsilon)) {
            weldmap[(ushort)thatpt] = (uint16_t)nearby[6];
            nearby[7] = nearby[7] + 1;
          }
          thatpt._0_2_ = (ushort)thatpt + 1;
        } while (((int)(uint)(ushort)thatpt < mesh->npoints) &&
                (pfVar6 = mesh->points + (int)((uint)(ushort)thatpt * 3),
                (int)*pfVar6 + gridsize * (int)pfVar6[1] + gridsize * gridsize * (int)pfVar6[2] ==
                iVar4));
      }
    }
    nearby[6] = nearby[6] + 1;
    _p_1 = _p_1 + 3;
  } while( true );
}

Assistant:

static void par_shapes__weld_points(par_shapes_mesh* mesh, int gridsize,
                                    float epsilon, PAR_SHAPES_T* weldmap)
{
    // Each bin contains a "pointer" (really an index) to its first point.
    // We add 1 because 0 is reserved to mean that the bin is empty.
    // Since the points are spatially sorted, there's no need to store
    // a point count in each bin.
    PAR_SHAPES_T* bins = PAR_CALLOC(PAR_SHAPES_T,
                                    gridsize * gridsize * gridsize);
    int prev_binindex = -1;
    for (int p = 0; p < mesh->npoints; p++) {
        float const* pt = mesh->points + p * 3;
        int i = (int) pt[0];
        int j = (int) pt[1];
        int k = (int) pt[2];
        int this_binindex = i + gridsize * j + gridsize * gridsize * k;
        if (this_binindex != prev_binindex) {
            bins[this_binindex] = 1 + p;
        }
        prev_binindex = this_binindex;
    }

    // Examine all bins that intersect the epsilon-sized cube centered at each
    // point, and check for colocated points within those bins.
    float const* pt = mesh->points;
    int nremoved = 0;
    for (int p = 0; p < mesh->npoints; p++, pt += 3) {

        // Skip if this point has already been welded.
        if (weldmap[p] != p) {
            continue;
        }

        // Build a list of bins that intersect the epsilon-sized cube.
        int nearby[8];
        int nbins = 0;
        int minp[3], maxp[3];
        for (int c = 0; c < 3; c++) {
            minp[c] = (int) (pt[c] - epsilon);
            maxp[c] = (int) (pt[c] + epsilon);
        }
        for (int i = minp[0]; i <= maxp[0]; i++) {
            for (int j = minp[1]; j <= maxp[1]; j++) {
                for (int k = minp[2]; k <= maxp[2]; k++) {
                    int binindex = i + gridsize * j + gridsize * gridsize * k;
                    PAR_SHAPES_T binvalue = *(bins + binindex);
                    if (binvalue > 0) {
                        if (nbins == 8) {
                            printf("Epsilon value is too large.\n");
                            break;
                        }
                        nearby[nbins++] = binindex;
                    }
                }
            }
        }

        // Check for colocated points in each nearby bin.
        for (int b = 0; b < nbins; b++) {
            int binindex = nearby[b];
            PAR_SHAPES_T binvalue = bins[binindex];
            PAR_SHAPES_T nindex = binvalue - 1;
            assert(nindex < mesh->npoints);
            while (true) {

                // If this isn't "self" and it's colocated, then weld it!
                if (nindex != p && weldmap[nindex] == nindex) {
                    float const* thatpt = mesh->points + nindex * 3;
                    float dist2 = par_shapes__sqrdist3(thatpt, pt);
                    if (dist2 < epsilon) {
                        weldmap[nindex] = p;
                        nremoved++;
                    }
                }

                // Advance to the next point if possible.
                if (++nindex >= mesh->npoints) {
                    break;
                }

                // If the next point is outside the bin, then we're done.
                float const* nextpt = mesh->points + nindex * 3;
                int i = (int) nextpt[0];
                int j = (int) nextpt[1];
                int k = (int) nextpt[2];
                int nextbinindex = i + gridsize * j + gridsize * gridsize * k;
                if (nextbinindex != binindex) {
                    break;
                }
            }
        }
    }
    PAR_FREE(bins);

    // Apply the weldmap to the vertices.
    int npoints = mesh->npoints - nremoved;
    float* newpts = PAR_MALLOC(float, 3 * npoints);
    float* dst = newpts;
    PAR_SHAPES_T* condensed_map = PAR_MALLOC(PAR_SHAPES_T, mesh->npoints);
    PAR_SHAPES_T* cmap = condensed_map;
    float const* src = mesh->points;
    int ci = 0;
    for (int p = 0; p < mesh->npoints; p++, src += 3) {
        if (weldmap[p] == p) {
            *dst++ = src[0];
            *dst++ = src[1];
            *dst++ = src[2];
            *cmap++ = ci++;
        } else {
            *cmap++ = condensed_map[weldmap[p]];
        }
    }
    assert(ci == npoints);
    PAR_FREE(mesh->points);
    memcpy(weldmap, condensed_map, mesh->npoints * sizeof(PAR_SHAPES_T));
    PAR_FREE(condensed_map);
    mesh->points = newpts;
    mesh->npoints = npoints;

    // Apply the weldmap to the triangle indices and skip the degenerates.
    PAR_SHAPES_T const* tsrc = mesh->triangles;
    PAR_SHAPES_T* tdst = mesh->triangles;
    int ntriangles = 0;
    for (int i = 0; i < mesh->ntriangles; i++, tsrc += 3) {
        PAR_SHAPES_T a = weldmap[tsrc[0]];
        PAR_SHAPES_T b = weldmap[tsrc[1]];
        PAR_SHAPES_T c = weldmap[tsrc[2]];
        if (a != b && a != c && b != c) {
            assert(a < mesh->npoints);
            assert(b < mesh->npoints);
            assert(c < mesh->npoints);
            *tdst++ = a;
            *tdst++ = b;
            *tdst++ = c;
            ntriangles++;
        }
    }
    mesh->ntriangles = ntriangles;
}